

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

UnicodeSet * anon_unknown.dwarf_2183a1::computeUnion(Key k1,Key k2,Key k3)

{
  UnicodeSet *pUVar1;
  undefined4 in_register_00000034;
  undefined8 local_48;
  UnicodeSet *result;
  Key k3_local;
  Key k2_local;
  Key k1_local;
  
  pUVar1 = (UnicodeSet *)
           icu_63::UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,k2));
  local_48 = (UnicodeSet *)0x0;
  if (pUVar1 != (UnicodeSet *)0x0) {
    icu_63::UnicodeSet::UnicodeSet(pUVar1);
    local_48 = pUVar1;
  }
  if (local_48 == (UnicodeSet *)0x0) {
    _k2_local = (UnicodeSet *)0x0;
  }
  else {
    pUVar1 = getImpl(k1);
    icu_63::UnicodeSet::addAll(local_48,pUVar1);
    pUVar1 = getImpl(k2);
    icu_63::UnicodeSet::addAll(local_48,pUVar1);
    pUVar1 = getImpl(k3);
    icu_63::UnicodeSet::addAll(local_48,pUVar1);
    icu_63::UnicodeSet::freeze(local_48);
    _k2_local = local_48;
  }
  return _k2_local;
}

Assistant:

UnicodeSet* computeUnion(Key k1, Key k2, Key k3) {
    UnicodeSet* result = new UnicodeSet();
    if (result == nullptr) {
        return nullptr;
    }
    result->addAll(*getImpl(k1));
    result->addAll(*getImpl(k2));
    result->addAll(*getImpl(k3));
    result->freeze();
    return result;
}